

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
          *samples)

{
  int iVar1;
  RenderSampleAnalyzeResult RVar2;
  const_reference pvVar3;
  TestLog *pTVar4;
  offset_in_SampleType_to_deUint64 in_RCX;
  float fVar5;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  LogNumber<float> local_c00;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  LogNumber<float> local_b20;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  LogNumber<float> local_a40;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  LogNumber<float> local_960;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  LogNumber<float> local_880;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  LogNumber<float> local_7a0;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  LogNumber<float> local_6c0;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  LogNumber<float> local_5e0;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  LogNumber<float> local_500;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  LogNumber<float> local_420;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  LogNumber<float> local_340;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  LogNumber<float> local_260;
  float local_1f8;
  float local_1f4;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedRenderTimeNoConstant;
  float approximatedRenderTime;
  int medianDataSize;
  allocator<char> local_1b9;
  string local_1b8;
  ScopedLogSection local_198;
  ScopedLogSection section_2;
  string local_188;
  allocator<char> local_161;
  string local_160;
  ScopedLogSection local_140;
  ScopedLogSection section_1;
  string local_130;
  allocator<char> local_f9;
  string local_f8;
  ScopedLogSection local_d8;
  ScopedLogSection section;
  float approximatedProcessingRateNoConstant;
  float approximatedProcessingRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  *samples_local;
  TestLog *log_local;
  RenderSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
              *)0x28,in_RCX);
  calculateSampleStatistics
            ((UploadRenderReadStatistics *)&approximatedProcessingRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Samples",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Samples",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_d8,log,&local_f8,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Contribution",&local_161)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"Contributions",(allocator<char> *)((long)&section_2.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_140,log,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  logFirstRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logUploadContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logSecondRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logReadContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logTotalContribution<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  tcu::ScopedLogSection::~ScopedLogSection(&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"Results",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianDataSize,"Results",
             (allocator<char> *)((long)&approximatedRenderTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_198,log,&local_1b8,(string *)&medianDataSize);
  std::__cxx11::string::~string((string *)&medianDataSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedRenderTime + 3));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           ::front(samples);
  iVar1 = pvVar3->renderDataSize;
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
           ::back(samples);
  approximatedRenderTimeNoConstant = (float)((iVar1 + pvVar3->renderDataSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant) /
       1000.0) / 1000.0;
  local_1f4 = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                        (samples);
  local_1f8 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                        (samples);
  section.m_log._4_4_ = (float)(int)approximatedRenderTimeNoConstant / sampleTemporalStability;
  fVar5 = (float)(int)approximatedRenderTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"ResultLinearity",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"Sample linearity",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"%",&local_2d1);
  tcu::LogNumber<float>::LogNumber
            (&local_260,&local_280,&local_2a8,&local_2d0,QP_KEY_TAG_QUALITY,local_1f4 * 100.0);
  pTVar4 = tcu::TestLog::operator<<(log,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"SampleTemporalStability",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Sample temporal stability",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"%",&local_3b1);
  tcu::LogNumber<float>::LogNumber
            (&local_340,&local_360,&local_388,&local_3b0,QP_KEY_TAG_QUALITY,local_1f8 * 100.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"ApproximatedConstantCost",&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"Approximated contant cost",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"us",&local_491);
  tcu::LogNumber<float>::LogNumber
            (&local_420,&local_440,&local_468,&local_490,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"ApproximatedConstantCostConfidence60Lower",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"Approximated contant cost 60% confidence lower limit",&local_549)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"us",&local_571);
  tcu::LogNumber<float>::LogNumber
            (&local_500,&local_520,&local_548,&local_570,QP_KEY_TAG_TIME,theilSenFitting.offset);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"ApproximatedConstantCostConfidence60Upper",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"Approximated contant cost 60% confidence upper limit",&local_629)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"us",&local_651);
  tcu::LogNumber<float>::LogNumber
            (&local_5e0,&local_600,&local_628,&local_650,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"ApproximatedLinearCost",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"Approximated linear cost",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"us / MB",&local_731);
  tcu::LogNumber<float>::LogNumber
            (&local_6c0,&local_6e0,&local_708,&local_730,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"ApproximatedLinearCostConfidence60Lower",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"Approximated linear cost 60% confidence lower limit",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"us / MB",&local_811);
  tcu::LogNumber<float>::LogNumber
            (&local_7a0,&local_7c0,&local_7e8,&local_810,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"ApproximatedLinearCostConfidence60Upper",&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"Approximated linear cost 60% confidence upper limit",&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"us / MB",&local_8f1);
  tcu::LogNumber<float>::LogNumber
            (&local_880,&local_8a0,&local_8c8,&local_8f0,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"ApproximatedProcessRate",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"Approximated processing rate",&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"MB / s",&local_9d1);
  tcu::LogNumber<float>::LogNumber
            (&local_960,&local_980,&local_9a8,&local_9d0,QP_KEY_TAG_PERFORMANCE,
             fVar5 * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a60,"ApproximatedProcessRateNoConstant",&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,"Approximated processing rate without constant cost",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"MB / s",&local_ab1);
  tcu::LogNumber<float>::LogNumber
            (&local_a40,&local_a60,&local_a88,&local_ab0,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_a40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b40,"SampleMedianTime",&local_b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b68,"Median sample time",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b90,"us",&local_b91);
  tcu::LogNumber<float>::LogNumber
            (&local_b20,&local_b40,&local_b68,&local_b90,QP_KEY_TAG_TIME,resultStats.result.minTime)
  ;
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_b20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c20,"SampleMedianProcess",&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c48,"Median processing rate",&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"MB / s",&local_c71);
  tcu::LogNumber<float>::LogNumber
            (&local_c00,&local_c20,&local_c48,&local_c70,QP_KEY_TAG_PERFORMANCE,
             resultStats.total.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar4,&local_c00);
  tcu::LogNumber<float>::~LogNumber(&local_c00);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator(&local_c49);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator(&local_c21);
  tcu::LogNumber<float>::~LogNumber(&local_b20);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  tcu::LogNumber<float>::~LogNumber(&local_a40);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  tcu::LogNumber<float>::~LogNumber(&local_960);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  tcu::LogNumber<float>::~LogNumber(&local_880);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  tcu::LogNumber<float>::~LogNumber(&local_7a0);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  tcu::LogNumber<float>::~LogNumber(&local_6c0);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  tcu::LogNumber<float>::~LogNumber(&local_5e0);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  tcu::LogNumber<float>::~LogNumber(&local_500);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  tcu::LogNumber<float>::~LogNumber(&local_420);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  tcu::LogNumber<float>::~LogNumber(&local_340);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  tcu::LogNumber<float>::~LogNumber(&local_260);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  tcu::ScopedLogSection::~ScopedLogSection(&local_198);
  RVar2.renderRateAtRange = fVar5;
  RVar2.renderRateMedian = resultStats.total.min2DecileTime;
  RVar2.renderRateAtInfinity = section.m_log._4_4_;
  return RVar2;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}